

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_table_as_typed_root
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  flatbuffers_uoffset_t offset;
  flatcc_table_verifier_f *tvf_local;
  flatbuffers_thash_t thash_local;
  size_t bufsiz_local;
  void *buf_local;
  
  iVar1 = flatcc_verify_typed_buffer_header(buf,bufsiz,thash);
  if (iVar1 == 0) {
    offset = read_uoffset(buf,0);
    buf_local._4_4_ = verify_table(buf,(flatbuffers_uoffset_t)bufsiz,0,offset,100,tvf);
  }
  else {
    buf_local._4_4_ = flatcc_verify_typed_buffer_header(buf,bufsiz,thash);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_table_as_typed_root(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_typed_buffer_header(buf, bufsiz, thash));
    return verify_table(buf, (uoffset_t)bufsiz, 0, read_uoffset(buf, 0), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}